

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

RPCHelpMan * getrpcinfo(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  RPCMethodImpl fun;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined8 in_stack_fffffffffffff898;
  undefined8 in_stack_fffffffffffff8a0;
  undefined8 in_stack_fffffffffffff8a8;
  undefined8 in_stack_fffffffffffff8b0;
  _Manager_type in_stack_fffffffffffff8b8;
  undefined8 in_stack_fffffffffffff8c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff8c8;
  pointer in_stack_fffffffffffff8d8;
  pointer pRVar2;
  pointer in_stack_fffffffffffff8e0;
  pointer pRVar3;
  pointer in_stack_fffffffffffff8e8;
  pointer pRVar4;
  undefined8 in_stack_fffffffffffff8f0;
  pointer pRVar5;
  pointer pRVar6;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff910;
  pointer pRVar8;
  pointer pRVar9;
  pointer pRVar10;
  undefined1 in_stack_fffffffffffff930 [24];
  allocator<char> local_6a2;
  allocator<char> local_6a1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_6a0;
  allocator<char> local_682;
  allocator<char> local_681;
  vector<RPCResult,_std::allocator<RPCResult>_> local_680;
  allocator<char> local_662;
  allocator<char> local_661;
  RPCResults local_660;
  vector<RPCArg,_std::allocator<RPCArg>_> local_648;
  allocator<char> local_62a;
  allocator<char> local_629;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  char *local_548;
  size_type local_540;
  char local_538 [8];
  undefined8 uStack_530;
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  RPCResult local_468 [2];
  string local_358 [32];
  string local_338 [32];
  RPCResult local_318;
  string local_290 [32];
  string local_270 [32];
  RPCResult local_250 [2];
  string local_140 [32];
  string local_120 [32];
  RPCResult local_100;
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getrpcinfo",&local_629);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"\nReturns details of the RPC server.\n",&local_62a);
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_120,"",&local_661);
  std::__cxx11::string::string<std::allocator<char>>(local_140,"",&local_662);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"active_commands",&local_681);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"All active commands",&local_682);
  std::__cxx11::string::string<std::allocator<char>>(local_338,"",&local_6a1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_358,"Information about an active command",&local_6a2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_488,"method",(allocator<char> *)&stack0xfffffffffffff93f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4a8,"The name of the RPC command",(allocator<char> *)&stack0xfffffffffffff93e);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff898;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description._M_string_length = in_stack_fffffffffffff8c0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description.field_2 = in_stack_fffffffffffff8c8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff8e0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff8d8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff8e8;
  RPCResult::RPCResult(local_468,STR,m_key_name,description,inner,SUB81(local_488,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_4c8,"duration",(allocator<char> *)&stack0xfffffffffffff917);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4e8,"The running time in microseconds",
             (allocator<char> *)&stack0xfffffffffffff916);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff898;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_00._M_string_length = in_stack_fffffffffffff8c0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_00.field_2._M_local_buf = in_stack_fffffffffffff8c8._M_local_buf;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff8e0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff8d8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff8e8;
  RPCResult::RPCResult(local_468 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_4c8,0));
  __l._M_len = 2;
  __l._M_array = local_468;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff940,__l,
             (allocator_type *)&stack0xfffffffffffff8f7);
  m_key_name_01._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff898;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_01._M_string_length = in_stack_fffffffffffff8c0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_01.field_2 = in_stack_fffffffffffff8c8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff8e0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff8d8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff8e8;
  RPCResult::RPCResult(&local_318,OBJ,m_key_name_01,description_01,inner_01,SUB81(local_338,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_318;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_6a0,__l_00,(allocator_type *)&stack0xfffffffffffff8f6);
  m_key_name_02._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff898;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_02._M_string_length = in_stack_fffffffffffff8c0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_02.field_2 = in_stack_fffffffffffff8c8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff8e0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff8d8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff8e8;
  RPCResult::RPCResult(local_250,ARR,m_key_name_02,description_02,inner_02,SUB81(local_270,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_508,"logpath",(allocator<char> *)&stack0xfffffffffffff8f5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_528,"The complete file path to the debug log",
             (allocator<char> *)&stack0xfffffffffffff8f4);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name_03._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff898;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_03._M_string_length = in_stack_fffffffffffff8c0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_03.field_2._M_local_buf = in_stack_fffffffffffff8c8._M_local_buf;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(local_250 + 1,STR,m_key_name_03,description_03,inner_03,SUB81(local_508,0));
  __l_01._M_len = 2;
  __l_01._M_array = local_250;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_680,__l_01,(allocator_type *)&stack0xfffffffffffff8d7);
  m_key_name_04._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff898;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_04._M_string_length = in_stack_fffffffffffff8c0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_04.field_2 = in_stack_fffffffffffff8c8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_100,OBJ,m_key_name_04,description_04,inner_04,SUB81(local_120,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8a0;
  result._0_8_ = in_stack_fffffffffffff898;
  result.m_key_name._M_string_length = in_stack_fffffffffffff8a8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8b0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff8b8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8c0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff8c8;
  result._64_8_ = pRVar2;
  result.m_description._M_dataplus._M_p = (pointer)pRVar3;
  result.m_description._M_string_length = (size_type)pRVar4;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff8f0;
  result.m_description.field_2._8_8_ = pRVar5;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar6;
  result.m_cond._M_string_length = (size_type)pRVar7;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff910;
  result.m_cond.field_2._8_8_ = pRVar8;
  RPCResults::RPCResults(&local_660,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"getrpcinfo",(allocator<char> *)&stack0xfffffffffffff8d6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"",(allocator<char> *)&stack0xfffffffffffff8d5);
  HelpExampleCli(&local_588,&local_5a8,&local_5c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"getrpcinfo",(allocator<char> *)&stack0xfffffffffffff8d4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"",(allocator<char> *)&stack0xfffffffffffff8d3);
  HelpExampleRpc(&local_5e8,&local_608,&local_628);
  std::operator+(&local_568,&local_588,&local_5e8);
  local_548 = local_538;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p == &local_568.field_2) {
    uStack_530 = local_568.field_2._8_8_;
  }
  else {
    local_548 = local_568._M_dataplus._M_p;
  }
  local_540 = local_568._M_string_length;
  local_568._M_string_length = 0;
  local_568.field_2._M_local_buf[0] = '\0';
  description_05._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/server.cpp:222:9)>
       ::_M_invoke;
  description_05._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/server.cpp:222:9)>
                ::_M_manager;
  description_05.field_2 = in_stack_fffffffffffff8c8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8f0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar6;
  examples.m_examples._M_string_length = in_stack_fffffffffffff910;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar7;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar8;
  examples.m_examples.field_2._8_8_ = pRVar9;
  fun._8_24_ = in_stack_fffffffffffff930;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar10;
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff8a0,&stack0xfffffffffffff8a8)),
             description_05,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff8a8);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_660.m_results);
  RPCResult::~RPCResult(&local_100);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_680);
  lVar1 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_250[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8d8);
  std::__cxx11::string::~string(local_528);
  std::__cxx11::string::~string(local_508);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_6a0);
  RPCResult::~RPCResult(&local_318);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff940);
  lVar1 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_468[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8f8);
  std::__cxx11::string::~string(local_4e8);
  std::__cxx11::string::~string(local_4c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff918);
  std::__cxx11::string::~string(local_4a8);
  std::__cxx11::string::~string(local_488);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_120);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_648);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getrpcinfo()
{
    return RPCHelpMan{"getrpcinfo",
                "\nReturns details of the RPC server.\n",
                {},
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::ARR, "active_commands", "All active commands",
                        {
                            {RPCResult::Type::OBJ, "", "Information about an active command",
                            {
                                 {RPCResult::Type::STR, "method", "The name of the RPC command"},
                                 {RPCResult::Type::NUM, "duration", "The running time in microseconds"},
                            }},
                        }},
                        {RPCResult::Type::STR, "logpath", "The complete file path to the debug log"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getrpcinfo", "")
                + HelpExampleRpc("getrpcinfo", "")},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    LOCK(g_rpc_server_info.mutex);
    UniValue active_commands(UniValue::VARR);
    for (const RPCCommandExecutionInfo& info : g_rpc_server_info.active_commands) {
        UniValue entry(UniValue::VOBJ);
        entry.pushKV("method", info.method);
        entry.pushKV("duration", int64_t{Ticks<std::chrono::microseconds>(SteadyClock::now() - info.start)});
        active_commands.push_back(std::move(entry));
    }

    UniValue result(UniValue::VOBJ);
    result.pushKV("active_commands", std::move(active_commands));

    const std::string path = LogInstance().m_file_path.utf8string();
    UniValue log_path(UniValue::VSTR, path);
    result.pushKV("logpath", std::move(log_path));

    return result;
}
    };
}